

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

uint64_t anon_unknown.dwarf_1440904::PolyMod(uint64_t c,int val)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  uVar3 = c >> 0x23;
  uVar1 = (long)val ^ (c & 0x7ffffffff) << 5;
  uVar2 = uVar1 ^ 0xf5dee51989;
  if ((c >> 0x23 & 1) == 0) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 ^ 0xa9fdca3312;
  if ((uVar3 & 2) == 0) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 ^ 0x1bab10e32d;
  if ((uVar3 & 4) == 0) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 ^ 0x3706b1677a;
  if ((uVar3 & 8) == 0) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 ^ 0x644d626ffd;
  if ((uVar3 & 0x10) == 0) {
    uVar2 = uVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t PolyMod(uint64_t c, int val)
{
    uint8_t c0 = c >> 35;
    c = ((c & 0x7ffffffff) << 5) ^ val;
    if (c0 & 1) c ^= 0xf5dee51989;
    if (c0 & 2) c ^= 0xa9fdca3312;
    if (c0 & 4) c ^= 0x1bab10e32d;
    if (c0 & 8) c ^= 0x3706b1677a;
    if (c0 & 16) c ^= 0x644d626ffd;
    return c;
}